

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarScrollingButtons(ImGuiTabBar *tab_bar)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec2 size;
  ImVec2 size_00;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImVec2 *lhs;
  ImGuiTabItem *tab;
  float fVar5;
  int local_12c;
  int target_order;
  int selected_order;
  ImGuiTabItem *tab_item;
  ImVec2 local_d8 [2];
  ImVec2 local_c8;
  float local_c0;
  float local_bc;
  float backup_repeat_rate;
  float backup_repeat_delay;
  undefined1 auStack_a8 [8];
  ImVec4 arrow_col;
  int local_8c;
  ImGuiTabItem *pIStack_88;
  int select_dir;
  ImGuiTabItem *tab_to_select;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImRect local_5c;
  byte local_49;
  undefined1 auStack_48 [7];
  bool want_clip_rect;
  ImRect avail_bar_rect;
  ImVec2 backup_cursor_pos;
  float fStack_28;
  float scrolling_buttons_width;
  ImVec2 arrow_button_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *tab_bar_local;
  
  pIVar3 = GImGui;
  arrow_button_size = (ImVec2)GImGui->CurrentWindow;
  fVar5 = (GImGui->Style).FramePadding.y;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,GImGui->FontSize + -2.0,
                 fVar5 + fVar5 + GImGui->FontSize);
  fVar5 = fStack_28 + fStack_28;
  avail_bar_rect.Max = *(ImVec2 *)((long)arrow_button_size + 0xd0);
  _auStack_48 = (tab_bar->BarRect).Min;
  avail_bar_rect.Min = (tab_bar->BarRect).Max;
  lhs = (ImVec2 *)((long)arrow_button_size + 0xd0);
  ImVec2::ImVec2(&local_6c,fVar5,0.0);
  local_64 = operator+(lhs,&local_6c);
  ImRect::ImRect(&local_5c,lhs,&local_64);
  bVar4 = ImRect::Contains((ImRect *)auStack_48,&local_5c);
  local_49 = (bVar4 ^ 0xffU) & 1;
  if (local_49 != 0) {
    ImVec2::ImVec2((ImVec2 *)((long)&tab_to_select + 4),(pIVar3->Style).ItemInnerSpacing.x,0.0);
    local_74 = operator+(&(tab_bar->BarRect).Max,(ImVec2 *)((long)&tab_to_select + 4));
    PushClipRect(&(tab_bar->BarRect).Min,&local_74,true);
  }
  pIStack_88 = (ImGuiTabItem *)0x0;
  local_8c = 0;
  auStack_a8._0_4_ = (pIVar3->Style).Colors[0].x;
  auStack_a8._4_4_ = (pIVar3->Style).Colors[0].y;
  uVar1 = (pIVar3->Style).Colors[0].z;
  uVar2 = (pIVar3->Style).Colors[0].w;
  arrow_col.y = (float)uVar2 * 0.5;
  arrow_col.x = (float)uVar1;
  PushStyleColor(0,(ImVec4 *)auStack_a8);
  ImVec4::ImVec4((ImVec4 *)&backup_repeat_rate,0.0,0.0,0.0,0.0);
  PushStyleColor(0x15,(ImVec4 *)&backup_repeat_rate);
  local_bc = (pIVar3->IO).KeyRepeatDelay;
  local_c0 = (pIVar3->IO).KeyRepeatRate;
  (pIVar3->IO).KeyRepeatDelay = 0.25;
  (pIVar3->IO).KeyRepeatRate = 0.2;
  ImVec2::ImVec2(&local_c8,(tab_bar->BarRect).Max.x - fVar5,(tab_bar->BarRect).Min.y);
  *(ImVec2 *)((long)arrow_button_size + 0xd0) = local_c8;
  size.y = scrolling_buttons_width;
  size.x = fStack_28;
  bVar4 = ArrowButtonEx("##<",0,size,5);
  if (bVar4) {
    local_8c = -1;
  }
  ImVec2::ImVec2(local_d8,((tab_bar->BarRect).Max.x - fVar5) + fStack_28,(tab_bar->BarRect).Min.y);
  *(ImVec2 *)((long)arrow_button_size + 0xd0) = local_d8[0];
  size_00.y = scrolling_buttons_width;
  size_00.x = fStack_28;
  bVar4 = ArrowButtonEx("##>",1,size_00,5);
  if (bVar4) {
    local_8c = 1;
  }
  PopStyleColor(2);
  (pIVar3->IO).KeyRepeatRate = local_c0;
  (pIVar3->IO).KeyRepeatDelay = local_bc;
  if ((local_49 & 1) != 0) {
    PopClipRect();
  }
  if ((local_8c != 0) &&
     (tab = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), tab != (ImGuiTabItem *)0x0)) {
    local_12c = ImGuiTabBar::GetTabOrder(tab_bar,tab);
    local_8c = local_12c + local_8c;
    if ((-1 < local_8c) && (local_8c < (tab_bar->Tabs).Size)) {
      local_12c = local_8c;
    }
    pIStack_88 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_12c);
  }
  *(ImVec2 *)((long)arrow_button_size + 0xd0) = avail_bar_rect.Max;
  (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar5 + 1.0);
  return pIStack_88;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarScrollingButtons(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImVec2 arrow_button_size(g.FontSize - 2.0f, g.FontSize + g.Style.FramePadding.y * 2.0f);
    const float scrolling_buttons_width = arrow_button_size.x * 2.0f;

    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    //window->DrawList->AddRect(ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width, tab_bar->BarRect.Min.y), ImVec2(tab_bar->BarRect.Max.x, tab_bar->BarRect.Max.y), IM_COL32(255,0,0,255));

    const ImRect avail_bar_rect = tab_bar->BarRect;
    bool want_clip_rect = !avail_bar_rect.Contains(ImRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(scrolling_buttons_width, 0.0f)));
    if (want_clip_rect)
        PushClipRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max + ImVec2(g.Style.ItemInnerSpacing.x, 0.0f), true);

    ImGuiTabItem* tab_to_select = NULL;

    int select_dir = 0;
    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;

    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    const float backup_repeat_delay = g.IO.KeyRepeatDelay;
    const float backup_repeat_rate = g.IO.KeyRepeatRate;
    g.IO.KeyRepeatDelay = 0.250f;
    g.IO.KeyRepeatRate = 0.200f;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##<", ImGuiDir_Left, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = -1;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width + arrow_button_size.x, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##>", ImGuiDir_Right, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = +1;
    PopStyleColor(2);
    g.IO.KeyRepeatRate = backup_repeat_rate;
    g.IO.KeyRepeatDelay = backup_repeat_delay;

    if (want_clip_rect)
        PopClipRect();

    if (select_dir != 0)
        if (ImGuiTabItem* tab_item = TabBarFindTabByID(tab_bar, tab_bar->SelectedTabId))
        {
            int selected_order = tab_bar->GetTabOrder(tab_item);
            int target_order = selected_order + select_dir;
            tab_to_select = &tab_bar->Tabs[(target_order >= 0 && target_order < tab_bar->Tabs.Size) ? target_order : selected_order]; // If we are at the end of the list, still scroll to make our tab visible
        }
    window->DC.CursorPos = backup_cursor_pos;
    tab_bar->BarRect.Max.x -= scrolling_buttons_width + 1.0f;

    return tab_to_select;
}